

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

string * __thiscall
t_swift_generator::base_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_base_type *type)

{
  bool bVar1;
  t_base tVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [12];
  string local_40;
  
  tVar2 = type->base_;
  switch((t_base_type *)(ulong)tVar2) {
  case (t_base_type *)0x0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Void";
    pcVar4 = "";
    break;
  case (t_base_type *)0x1:
    iVar3 = (*(type->super_t_type).super_t_doc._vptr_t_doc[7])(type);
    if ((char)iVar3 == '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "String";
      pcVar4 = "";
    }
    else {
      bVar1 = this->gen_cocoa_;
      pcVar5 = "Data";
      if ((ulong)bVar1 != 0) {
        pcVar5 = "TBinary";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = pcVar5 + (ulong)bVar1 * 3 + 4;
    }
    break;
  case (t_base_type *)0x2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Bool";
    pcVar4 = "";
    break;
  case (t_base_type *)0x3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int8";
    pcVar4 = "";
    break;
  case (t_base_type *)0x4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int16";
    pcVar4 = "";
    break;
  case (t_base_type *)0x5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int32";
    pcVar4 = "";
    break;
  case (t_base_type *)0x6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Int64";
    pcVar4 = "";
    break;
  case (t_base_type *)0x7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Double";
    pcVar4 = "";
    break;
  default:
    auVar6 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_40,(t_base_type *)(ulong)tVar2,auVar6._8_4_);
    std::operator+(auVar6._0_8_,"compiler error: no Swift name for base type ",&local_40);
    __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

t_swift_generator(t_program* program,
                    const map<string, string>& parsed_options,
                    const string& option_string)
    : t_oop_generator(program) {
    update_keywords();
	
    (void)option_string;
    map<string, string>::const_iterator iter;

    log_unexpected_ = false;
    async_clients_ = false;
    debug_descriptions_ = false;
    no_strict_ = false;
    namespaced_ = false;
    gen_cocoa_ = false;
    promise_kit_ = false;
    safe_enums_ = false;

    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("log_unexpected") == 0) {
        log_unexpected_ = true;
      } else if( iter->first.compare("async_clients") == 0) {
        async_clients_ = true;
      } else if( iter->first.compare("no_strict") == 0) {
        no_strict_ = true;
      } else if( iter->first.compare("debug_descriptions") == 0) {
        debug_descriptions_ = true;
      } else if( iter->first.compare("namespaced") == 0) {
        namespaced_ = true;
      } else if( iter->first.compare("cocoa") == 0) {
        gen_cocoa_ = true;
      } else if( iter->first.compare("safe_enums") == 0) {
        safe_enums_ = true;
      } else if( iter->first.compare("promise_kit") == 0) {
        if (gen_cocoa_ == false) {
          throw "PromiseKit only available with Swift 2.x, use `cocoa` option" + iter->first;
        }
        promise_kit_ = true;
      } else {
        throw "unknown option swift:" + iter->first;
      }
    }

    out_dir_base_ = "gen-swift";
  }